

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O1

void __thiscall SFFile::TranslatePercussionPreset(SFFile *this,SFPreset *preset)

{
  ushort uVar1;
  SFBag *pSVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = preset->BagIndex;
  uVar4 = (ulong)uVar1;
  if (uVar1 < preset[1].BagIndex) {
    lVar3 = (ulong)((uint)uVar1 * 4) * 3;
    do {
      pSVar2 = this->PresetBags;
      if (((-1 < *(int *)((long)&pSVar2->Target + lVar3)) &&
          (-1 < (char)(&(pSVar2->KeyRange).Lo)[lVar3])) &&
         (-1 < (char)(&(pSVar2->VelRange).Lo)[lVar3])) {
        TranslatePercussionPresetZone(this,preset,(SFBag *)((long)&pSVar2->GenIndex + lVar3));
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0xc;
    } while (uVar4 < preset[1].BagIndex);
  }
  return;
}

Assistant:

void SFFile::TranslatePercussionPreset(SFPreset *preset)
{
	SFPerc perc;
	int i;
	bool has_global;
	
	perc.LoadOrder = preset->LoadOrder;
	i = preset->BagIndex;
	has_global = false;

	for (i = preset->BagIndex; i < (preset + 1)->BagIndex; ++i)
	{
		if (PresetBags[i].Target < 0)
		{ // This preset zone has no instrument.
			continue;
		}
		if (PresetBags[i].KeyRange.Lo > 127 || PresetBags[i].VelRange.Lo > 127)
		{ // This preset zone is inaccesible.
			continue;
		}
		TranslatePercussionPresetZone(preset, &PresetBags[i]);
	}
}